

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O2

void inputMethodInstantiateCallback(Display *display,XPointer clientData,XPointer callData)

{
  long lVar1;
  char *pcVar2;
  uint i;
  ulong uVar3;
  _GLFWwindow *window;
  XIMCallback callback;
  ushort *local_18;
  code *local_10;
  
  if (_glfw.x11.im == (XIM)0x0) {
    _glfw.x11.im = (*_glfw.x11.xlib.OpenIM)
                             (_glfw.x11.display,(XrmDatabase *)0x0,(char *)0x0,(char *)0x0);
    if (_glfw.x11.im != (XIM)0x0) {
      local_18 = (ushort *)0x0;
      pcVar2 = (*_glfw.x11.xlib.GetIMValues)(_glfw.x11.im,"queryInputStyle");
      if (pcVar2 == (char *)0x0) {
        uVar3 = 0;
        do {
          if (*local_18 == uVar3) {
            (*_glfw.x11.xlib.Free)(local_18);
            goto LAB_0016e587;
          }
          lVar1 = uVar3 * 8;
          uVar3 = uVar3 + 1;
        } while (*(long *)(*(long *)(local_18 + 4) + lVar1) != 0x408);
        (*_glfw.x11.xlib.Free)(local_18);
        if (_glfw.x11.im != (XIM)0x0) {
          local_10 = inputMethodDestroyCallback;
          local_18 = (ushort *)0x0;
          (*_glfw.x11.xlib.SetIMValues)(_glfw.x11.im,"destroyCallback",&local_18,0);
          window = (_GLFWwindow *)&_glfw.windowListHead;
          while (window = window->next, window != (_GLFWwindow *)0x0) {
            _glfwCreateInputContextX11(window);
          }
        }
      }
      else {
LAB_0016e587:
        (*_glfw.x11.xlib.CloseIM)(_glfw.x11.im);
        _glfw.x11.im = (XIM)0x0;
      }
    }
  }
  return;
}

Assistant:

static void inputMethodInstantiateCallback(Display* display,
                                           XPointer clientData,
                                           XPointer callData)
{
    if (_glfw.x11.im)
        return;

    _glfw.x11.im = XOpenIM(_glfw.x11.display, 0, NULL, NULL);
    if (_glfw.x11.im)
    {
        if (!hasUsableInputMethodStyle())
        {
            XCloseIM(_glfw.x11.im);
            _glfw.x11.im = NULL;
        }
    }

    if (_glfw.x11.im)
    {
        XIMCallback callback;
        callback.callback = (XIMProc) inputMethodDestroyCallback;
        callback.client_data = NULL;
        XSetIMValues(_glfw.x11.im, XNDestroyCallback, &callback, NULL);

        for (_GLFWwindow* window = _glfw.windowListHead;  window;  window = window->next)
            _glfwCreateInputContextX11(window);
    }
}